

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void wallet::wallet_tests::ComputeTimeSmart_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  ComputeTimeSmart t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28 [3];
  ios_base local_ab8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  undefined1 local_990 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818 [62];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b30 = "";
  memset((ostringstream *)local_990,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_990);
  local_818[0]._M_string_length = 0;
  local_818[0].field_2._M_local_buf[0] = '\0';
  local_b28[0]._M_dataplus._M_p._0_1_ = 0x22;
  local_818[0]._M_dataplus._M_p = (pointer)&local_818[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_990,(char *)local_b28,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_990,"ComputeTimeSmart",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_990,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_818,local_b28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b28[0]._M_dataplus._M_p._1_7_,local_b28[0]._M_dataplus._M_p._0_1_) !=
      &local_b28[0].field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_b28[0]._M_dataplus._M_p._1_7_,local_b28[0]._M_dataplus._M_p._0_1_
                            ),local_b28[0].field_2._M_allocated_capacity + 1);
  }
  local_b48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_818[0]._M_dataplus._M_p;
  local_b40 = local_818[0]._M_dataplus._M_p + local_818[0]._M_string_length;
  file.m_end = (iterator)0x1a8;
  file.m_begin = (iterator)&local_b38;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_b48,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818[0]._M_dataplus._M_p != &local_818[0].field_2) {
    operator_delete(local_818[0]._M_dataplus._M_p,
                    CONCAT71(local_818[0].field_2._M_allocated_capacity._1_7_,
                             local_818[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_990);
  std::ios_base::~ios_base((ios_base *)(local_990 + 0x70));
  WalletTestingSetup::WalletTestingSetup((WalletTestingSetup *)local_990,MAIN);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b50 = "";
  memset(local_b28,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
  paVar1 = &local_9b0.field_2;
  local_9b0._M_string_length = 0;
  local_9b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"ComputeTimeSmart",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b0,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_b68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b0._M_dataplus._M_p;
  local_b60 = local_9b0._M_dataplus._M_p + local_9b0._M_string_length;
  file_00.m_end = (iterator)0x1a8;
  file_00.m_begin = (iterator)&local_b58;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_b68,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b0._M_dataplus._M_p,
                    CONCAT71(local_9b0.field_2._M_allocated_capacity._1_7_,
                             local_9b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
  std::ios_base::~ios_base(local_ab8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b70 = "";
  memset(local_b28,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
  local_9b0._M_string_length = 0;
  local_9b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"ComputeTimeSmart",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_b88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b0._M_dataplus._M_p;
  local_b80 = local_9b0._M_dataplus._M_p + local_9b0._M_string_length;
  file_01.m_end = (iterator)0x1a8;
  file_01.m_begin = (iterator)&local_b78;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_b88,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b0._M_dataplus._M_p,
                    CONCAT71(local_9b0.field_2._M_allocated_capacity._1_7_,
                             local_9b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
  std::ios_base::~ios_base(local_ab8);
  ComputeTimeSmart::test_method((ComputeTimeSmart *)local_990);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_b90 = "";
  memset(local_b28,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
  local_9b0._M_string_length = 0;
  local_9b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"ComputeTimeSmart",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b28,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_ba8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b0._M_dataplus._M_p;
  local_ba0 = local_9b0._M_dataplus._M_p + local_9b0._M_string_length;
  file_02.m_end = (iterator)0x1a8;
  file_02.m_begin = (iterator)&local_b98;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_ba8,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b0._M_dataplus._M_p,
                    CONCAT71(local_9b0.field_2._M_allocated_capacity._1_7_,
                             local_9b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
  std::ios_base::~ios_base(local_ab8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_bb8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_bb0 = "";
  memset(local_b28,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
  local_9b0._M_string_length = 0;
  local_9b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"ComputeTimeSmart",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b28,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_bc8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b0._M_dataplus._M_p;
  local_bc0 = local_9b0._M_dataplus._M_p + local_9b0._M_string_length;
  file_03.m_end = (iterator)0x1a8;
  file_03.m_begin = (iterator)&local_bb8;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_bc8,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b0._M_dataplus._M_p,
                    CONCAT71(local_9b0.field_2._M_allocated_capacity._1_7_,
                             local_9b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
  std::ios_base::~ios_base(local_ab8);
  WalletTestingSetup::~WalletTestingSetup((WalletTestingSetup *)local_990);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ComputeTimeSmart)
{
    // New transaction should use clock time if lower than block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 100, 120), 100);

    // Test that updating existing transaction does not change smart time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 200, 220), 100);

    // New transaction should use clock time if there's no block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 2, 300, 0), 300);

    // New transaction should use block time if lower than clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 3, 420, 400), 400);

    // New transaction should use latest entry time if higher than
    // min(block time, clock time).
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 4, 500, 390), 400);

    // If there are future entries, new transaction should use time of the
    // newest entry that is no more than 300 seconds ahead of the clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 5, 50, 600), 300);
}